

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O3

void __thiscall CVmObjDict::add_undo_rec(CVmObjDict *this,vm_obj_id_t self,dict_undo_rec *rec)

{
  int iVar1;
  vm_val_t val;
  vm_val_t local_18;
  
  local_18.typ = VM_EMPTY;
  iVar1 = CVmUndo::add_new_record_ptr_key(G_undo_X,self,rec,&local_18);
  if (iVar1 == 0) {
    free(rec);
  }
  return;
}

Assistant:

void CVmObjDict::add_undo_rec(VMG_ vm_obj_id_t self, dict_undo_rec *rec)
{
    vm_val_t val;

    /* add the record with an empty value */
    val.set_empty();
    if (!G_undo->add_new_record_ptr_key(vmg_ self, rec, &val))
    {
        /* 
         *   we didn't add an undo record, so our extra undo information
         *   isn't actually going to be stored in the undo system - hence
         *   we must delete our extra information 
         */
        t3free(rec);
    }
}